

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

void __thiscall libtorrent::torrent_info::~torrent_info(torrent_info *this)

{
  torrent_info *this_local;
  
  bdecode_node::~bdecode_node(&this->m_info_dict);
  ::std::__cxx11::string::~string((string *)&this->m_created_by);
  ::std::__cxx11::string::~string((string *)&this->m_comment);
  boost::shared_array<char>::~shared_array(&this->m_info_section);
  libtorrent::aux::
  container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::~container_wrapper(&this->m_piece_layers);
  libtorrent::aux::
  container_wrapper<libtorrent::digest32<160L>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
  ::~container_wrapper(&this->m_merkle_tree);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_owned_collections);
  ::std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            (&this->m_collections);
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::~vector
            (&this->m_owned_similar_torrents);
  ::std::vector<int,_std::allocator<int>_>::~vector(&this->m_similar_torrents);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&this->m_nodes);
  ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::~vector
            (&this->m_web_seeds);
  libtorrent::aux::
  container_wrapper<libtorrent::v1_2::announce_entry,_int,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  ::~container_wrapper(&this->m_urls);
  libtorrent::aux::copy_ptr<const_libtorrent::file_storage>::~copy_ptr(&this->m_orig_files);
  file_storage::~file_storage(&this->m_files);
  return;
}

Assistant:

torrent_info::~torrent_info() = default;